

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.c
# Opt level: O1

void expulsion(boolean seal)

{
  branch *pbVar1;
  d_level *tolev;
  
  pbVar1 = dungeon_branch("The Quest");
  tolev = &pbVar1->end1;
  if ((pbVar1->end1).dnum == u.uz.dnum) {
    tolev = &pbVar1->end2;
  }
  schedule_goto(tolev,'\0','\0',(uint)((u.uevent._0_2_ & 0x10) == 0),(char *)0x0,(char *)0x0);
  return;
}

Assistant:

static void expulsion(boolean seal)
{
    branch *br;
    d_level *dest;
    struct trap *t;
    int portal_flag;

    br = dungeon_branch("The Quest");
    dest = (br->end1.dnum == u.uz.dnum) ? &br->end2 : &br->end1;
    portal_flag = u.uevent.qexpelled ? 0 :	/* returned via artifact? */
		  !seal ? 1 : -1;
    schedule_goto(dest, FALSE, FALSE, portal_flag, NULL, NULL);
    if (seal) {	/* remove the portal to the quest - sealing it off */
	int reexpelled = u.uevent.qexpelled;
	u.uevent.qexpelled = 1;
	historic_event(FALSE, "were expelled from the quest.");
	/* Delete the near portal now; the far (main dungeon side)
	   portal will be deleted as part of arrival on that level.
	   If monster movement is in progress, any who haven't moved
	   yet will now miss out on a chance to wander through it... */
	for (t = level->lev_traps; t; t = t->ntrap)
	    if (t->ttyp == MAGIC_PORTAL) break;
	if (t) deltrap(level, t);	/* (display might be briefly out of sync) */
	else if (!reexpelled) impossible("quest portal already gone?");
    }
}